

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
nnad::Matrix<double>::Matrix
          (Matrix<double> *this,int *Lines,int *Columns,
          vector<double,_std::allocator<double>_> *Entries)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  vector<double,_std::allocator<double>_> *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = *in_RDX;
  std::vector<double,_std::allocator<double>_>::vector(in_RCX,in_stack_ffffffffffffffd8);
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
  if (iVar1 * iVar2 != (int)sVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    Error((string *)0x111581);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

Matrix(int const& Lines, int const& Columns, std::vector<T> const& Entries):
      _Lines(Lines),
      _Columns(Columns),
      _Matrix(Entries)
    {
      // Check that the size of the Entries match the size of the
      // matrix.
      if (_Lines * _Columns != (int) Entries.size())
        Error("Matrix: the size of the input vector does not match the size of the matrix.");
    }